

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12.c
# Opt level: O2

int mbedtls_pkcs12_derivation
              (uchar *data,size_t datalen,uchar *pwd,size_t pwdlen,uchar *salt,size_t saltlen,
              mbedtls_md_type_t md_type,int id,int iterations)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  mbedtls_md_info_t *md_info;
  size_t sVar4;
  uchar *p_1;
  ulong uVar5;
  size_t __n;
  size_t sVar6;
  ulong ilen;
  size_t sVar7;
  uchar *p;
  uchar *puVar8;
  ulong local_2a8;
  uchar *local_298;
  mbedtls_md_context_t md_ctx;
  uchar hash_block [128];
  uchar pwd_block [128];
  uchar salt_block [128];
  uchar hash_output [64];
  uchar diversifier [128];
  
  iVar2 = -0x1f80;
  if (saltlen < 0x41 && (pwdlen < 0x41 && datalen < 0x81)) {
    md_info = mbedtls_md_info_from_type(md_type);
    if (md_info == (mbedtls_md_info_t *)0x0) {
      iVar2 = -0x1f00;
    }
    else {
      mbedtls_md_init(&md_ctx);
      iVar2 = mbedtls_md_setup(&md_ctx,md_info,0);
      if (iVar2 == 0) {
        bVar1 = mbedtls_md_get_size(md_info);
        __n = (ulong)(0x20 < bVar1) * 0x40 + 0x40;
        memset(diversifier,id,__n);
        puVar8 = salt_block;
        for (sVar6 = __n; sVar6 != 0; sVar6 = sVar6 - sVar7) {
          sVar7 = saltlen;
          if (sVar6 < saltlen) {
            sVar7 = sVar6;
          }
          memcpy(puVar8,salt,sVar7);
          puVar8 = puVar8 + sVar7;
        }
        puVar8 = pwd_block;
        for (sVar6 = __n; sVar6 != 0; sVar6 = sVar6 - sVar7) {
          sVar7 = pwdlen;
          if (sVar6 < pwdlen) {
            sVar7 = sVar6;
          }
          memcpy(puVar8,pwd,sVar7);
          puVar8 = puVar8 + sVar7;
        }
        ilen = (ulong)bVar1;
        local_2a8 = datalen;
        local_298 = data;
        while (local_2a8 != 0) {
          iVar2 = mbedtls_md_starts(&md_ctx);
          if ((((iVar2 != 0) || (iVar2 = mbedtls_md_update(&md_ctx,diversifier,__n), iVar2 != 0)) ||
              (iVar2 = mbedtls_md_update(&md_ctx,salt_block,__n), iVar2 != 0)) ||
             ((iVar2 = mbedtls_md_update(&md_ctx,pwd_block,__n), iVar2 != 0 ||
              (iVar2 = mbedtls_md_finish(&md_ctx,hash_output), iVar2 != 0)))) goto LAB_0012c497;
          uVar5 = 0;
          while (uVar5 = uVar5 + 1, uVar5 < (ulong)(long)iterations) {
            iVar2 = mbedtls_md(md_info,hash_output,ilen,hash_output);
            if (iVar2 != 0) goto LAB_0012c497;
          }
          uVar5 = ilen;
          if (local_2a8 < ilen) {
            uVar5 = local_2a8;
          }
          memcpy(local_298,hash_output,uVar5);
          local_2a8 = local_2a8 - uVar5;
          iVar2 = 0;
          if (local_2a8 == 0) goto LAB_0012c497;
          local_298 = local_298 + uVar5;
          puVar8 = hash_block;
          for (sVar6 = __n; sVar4 = __n, sVar6 != 0; sVar6 = sVar6 - uVar5) {
            uVar5 = ilen;
            if (sVar6 < ilen) {
              uVar5 = sVar6;
            }
            memcpy(puVar8,hash_output,uVar5);
            puVar8 = puVar8 + uVar5;
          }
          do {
            if (sVar4 == 0) break;
            puVar8 = hash_block + (sVar4 - 1);
            *puVar8 = *puVar8 + '\x01';
            sVar4 = sVar4 - 1;
          } while (*puVar8 == '\0');
          uVar3 = 0;
          sVar6 = __n;
          while (sVar6 != 0) {
            uVar3 = uVar3 + pwd_block[sVar6 + 0x7f] + (uint)hash_block[sVar6 - 1];
            pwd_block[sVar6 + 0x7f] = (uchar)uVar3;
            uVar3 = uVar3 >> 8;
            sVar6 = sVar6 - 1;
          }
          uVar3 = 0;
          sVar6 = __n;
          while (sVar6 != 0) {
            uVar3 = uVar3 + hash_block[sVar6 + 0x7f] + (uint)hash_block[sVar6 - 1];
            hash_block[sVar6 + 0x7f] = (uchar)uVar3;
            uVar3 = uVar3 >> 8;
            sVar6 = sVar6 - 1;
          }
        }
        iVar2 = 0;
LAB_0012c497:
        mbedtls_zeroize(salt_block,0x80);
        mbedtls_zeroize(pwd_block,0x80);
        mbedtls_zeroize(hash_block,0x80);
        mbedtls_zeroize(hash_output,0x40);
        mbedtls_md_free(&md_ctx);
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_pkcs12_derivation( unsigned char *data, size_t datalen,
                       const unsigned char *pwd, size_t pwdlen,
                       const unsigned char *salt, size_t saltlen,
                       mbedtls_md_type_t md_type, int id, int iterations )
{
    int ret;
    unsigned int j;

    unsigned char diversifier[128];
    unsigned char salt_block[128], pwd_block[128], hash_block[128];
    unsigned char hash_output[MBEDTLS_MD_MAX_SIZE];
    unsigned char *p;
    unsigned char c;

    size_t hlen, use_len, v, i;

    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    // This version only allows max of 64 bytes of password or salt
    if( datalen > 128 || pwdlen > 64 || saltlen > 64 )
        return( MBEDTLS_ERR_PKCS12_BAD_INPUT_DATA );

    md_info = mbedtls_md_info_from_type( md_type );
    if( md_info == NULL )
        return( MBEDTLS_ERR_PKCS12_FEATURE_UNAVAILABLE );

    mbedtls_md_init( &md_ctx );

    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
        return( ret );
    hlen = mbedtls_md_get_size( md_info );

    if( hlen <= 32 )
        v = 64;
    else
        v = 128;

    memset( diversifier, (unsigned char) id, v );

    pkcs12_fill_buffer( salt_block, v, salt, saltlen );
    pkcs12_fill_buffer( pwd_block,  v, pwd,  pwdlen  );

    p = data;
    while( datalen > 0 )
    {
        // Calculate hash( diversifier || salt_block || pwd_block )
        if( ( ret = mbedtls_md_starts( &md_ctx ) ) != 0 )
            goto exit;

        if( ( ret = mbedtls_md_update( &md_ctx, diversifier, v ) ) != 0 )
            goto exit;

        if( ( ret = mbedtls_md_update( &md_ctx, salt_block, v ) ) != 0 )
            goto exit;

        if( ( ret = mbedtls_md_update( &md_ctx, pwd_block, v ) ) != 0 )
            goto exit;

        if( ( ret = mbedtls_md_finish( &md_ctx, hash_output ) ) != 0 )
            goto exit;

        // Perform remaining ( iterations - 1 ) recursive hash calculations
        for( i = 1; i < (size_t) iterations; i++ )
        {
            if( ( ret = mbedtls_md( md_info, hash_output, hlen, hash_output ) ) != 0 )
                goto exit;
        }

        use_len = ( datalen > hlen ) ? hlen : datalen;
        memcpy( p, hash_output, use_len );
        datalen -= use_len;
        p += use_len;

        if( datalen == 0 )
            break;

        // Concatenating copies of hash_output into hash_block (B)
        pkcs12_fill_buffer( hash_block, v, hash_output, hlen );

        // B += 1
        for( i = v; i > 0; i-- )
            if( ++hash_block[i - 1] != 0 )
                break;

        // salt_block += B
        c = 0;
        for( i = v; i > 0; i-- )
        {
            j = salt_block[i - 1] + hash_block[i - 1] + c;
            c = (unsigned char) (j >> 8);
            salt_block[i - 1] = j & 0xFF;
        }

        // pwd_block  += B
        c = 0;
        for( i = v; i > 0; i-- )
        {
            j = pwd_block[i - 1] + hash_block[i - 1] + c;
            c = (unsigned char) (j >> 8);
            pwd_block[i - 1] = j & 0xFF;
        }
    }

    ret = 0;

exit:
    mbedtls_zeroize( salt_block, sizeof( salt_block ) );
    mbedtls_zeroize( pwd_block, sizeof( pwd_block ) );
    mbedtls_zeroize( hash_block, sizeof( hash_block ) );
    mbedtls_zeroize( hash_output, sizeof( hash_output ) );

    mbedtls_md_free( &md_ctx );

    return( ret );
}